

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::IntegratorBuilder<OpenMD::NVT>::~IntegratorBuilder(IntegratorBuilder<OpenMD::NVT> *this)

{
  void *in_RDI;
  
  ~IntegratorBuilder((IntegratorBuilder<OpenMD::NVT> *)0x1f3b08);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

IntegratorBuilder(const std::string& ident) : IntegratorCreator(ident) {}